

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9SBmc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int local_9c;
  int c;
  Bmc_AndPar_t *pPars;
  Bmc_AndPar_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars.pFuncOnFrameDone = (_func_void_int_int_int *)argv;
  memset((Bmc_AndPar_t *)&pPars,0,0x58);
  pPars._0_4_ = 0;
  pPars._4_4_ = 0;
  Pars.nStart = 1;
  Pars.nFramesMax = 0;
  Pars.nFramesAdd = 0;
  Pars.nConfLimit = 0;
  Pars.nTimeOut = 1;
  Pars.nLutSize = 0;
  Pars.nProcs = 0;
  Pars.fLoadCnf = 0;
  Pars.fDumpFrames = 0;
  Pars.fUseSynth = 0;
  Pars.fUseOldCnf = 0;
  Pars.fUseGlucose = 0;
  Pars.fUseEliminate = 0;
  Pars.fVerbose = 0;
  Pars.fVeryVerbose = 0;
  Pars.fNotVerbose = 0;
  Pars.iFrame = 0;
  Pars._72_8_ = pAbc->pFuncOnFrameDone;
  Extra_UtilGetoptReset();
LAB_002bc6c8:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars.pFuncOnFrameDone,"PCFATgevwh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Bmcs(): There is no AIG.\n");
        return 0;
      }
      if (4 < Pars.nTimeOut) {
        Abc_Print(-1,
                  "Abc_CommandAbc9Bmcs(): Currently this command can run at most 4 concurrent solvers.\n"
                 );
        return 0;
      }
      if (Pars.fUseSynth == 0) {
        local_9c = Bmcs_ManPerform(pAbc->pGia,(Bmc_AndPar_t *)&pPars);
      }
      else {
        local_9c = Bmcg_ManPerform(pAbc->pGia,(Bmc_AndPar_t *)&pPars);
      }
      pAbc->Status = local_9c;
      pAbc->nFrames = Pars.fVeryVerbose;
      Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
      return 0;
    }
    switch(iVar1) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by an integer.\n");
        goto LAB_002bca6d;
      }
      Pars.nStart = atoi(*(char **)(Pars.pFuncOnFrameDone + (long)globalUtilOptind * 8));
      uVar2 = Pars.nStart;
      break;
    default:
      goto LAB_002bca6d;
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002bca6d;
      }
      Pars.nFramesMax = atoi(*(char **)(Pars.pFuncOnFrameDone + (long)globalUtilOptind * 8));
      uVar2 = Pars.nFramesMax;
      break;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_002bca6d;
      }
      pPars._4_4_ = atoi(*(char **)(Pars.pFuncOnFrameDone + (long)globalUtilOptind * 8));
      uVar2 = pPars._4_4_;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_002bca6d;
      }
      Pars.nTimeOut = atoi(*(char **)(Pars.pFuncOnFrameDone + (long)globalUtilOptind * 8));
      uVar2 = Pars.nTimeOut;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002bca6d;
      }
      Pars.nFramesAdd = atoi(*(char **)(Pars.pFuncOnFrameDone + (long)globalUtilOptind * 8));
      uVar2 = Pars.nFramesAdd;
      break;
    case 0x65:
      Pars.fUseOldCnf = Pars.fUseOldCnf ^ 1;
      goto LAB_002bc6c8;
    case 0x67:
      Pars.fUseSynth = Pars.fUseSynth ^ 1;
      goto LAB_002bc6c8;
    case 0x68:
      goto LAB_002bca6d;
    case 0x76:
      Pars.fUseGlucose = Pars.fUseGlucose ^ 1;
      goto LAB_002bc6c8;
    case 0x77:
      Pars.fUseEliminate = Pars.fUseEliminate ^ 1;
      goto LAB_002bc6c8;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_002bca6d:
      Abc_Print(-2,"usage: &bmcs [-PCFAT num] [-gevwh]\n");
      Abc_Print(-2,"\t         performs bounded model checking\n");
      Abc_Print(-2,"\t-P num : the number of parallel solvers [default = %d]\n",
                (ulong)(uint)Pars.nTimeOut);
      Abc_Print(-2,"\t-C num : the SAT solver conflict limit [default = %d]\n",
                (ulong)(uint)Pars.nFramesMax);
      Abc_Print(-2,"\t-F num : the maximum number of timeframes [default = %d]\n",(ulong)pPars._4_4_
               );
      Abc_Print(-2,"\t-A num : the number of additional frames to unroll [default = %d]\n",
                (ulong)(uint)Pars.nStart);
      Abc_Print(-2,"\t-T num : approximate timeout in seconds [default = %d]\n",
                (ulong)(uint)Pars.nFramesAdd);
      pcVar3 = "Satoko";
      if (Pars.fUseSynth != 0) {
        pcVar3 = "Glucose";
      }
      Abc_Print(-2,
                "\t-g     : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n"
                ,pcVar3);
      pcVar3 = "no";
      if (Pars.fUseOldCnf != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-e     : toggle using variable eliminatation [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fUseGlucose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fUseEliminate != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w     : toggle printing information about unfolding [default = %s]\n",pcVar3)
      ;
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9SBmc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Bmcs_ManPerform( Gia_Man_t * pGia, Bmc_AndPar_t * pPars );
    extern int Bmcg_ManPerform( Gia_Man_t * pGia, Bmc_AndPar_t * pPars );
    Bmc_AndPar_t Pars, * pPars = &Pars; int c;
    memset( pPars, 0, sizeof(Bmc_AndPar_t) );
    pPars->nStart        =    0;  // starting timeframe
    pPars->nFramesMax    =    0;  // maximum number of timeframes
    pPars->nFramesAdd    =    1;  // the number of additional frames
    pPars->nConfLimit    =    0;  // maximum number of conflicts at a node
    pPars->nTimeOut      =    0;  // timeout in seconds
    pPars->nLutSize      =    0;  // max LUT size for CNF computation
    pPars->nProcs        =    1;  // the number of parallel solvers
    pPars->fLoadCnf      =    0;  // dynamic CNF loading
    pPars->fDumpFrames   =    0;  // dump unrolled timeframes
    pPars->fUseSynth     =    0;  // use synthesis
    pPars->fUseOldCnf    =    0;  // use old CNF construction
    pPars->fUseGlucose   =    0;  // use Glucose 3.0
    pPars->fUseEliminate =    0;  // use variable elimination
    pPars->fVerbose      =    0;  // verbose
    pPars->fVeryVerbose  =    0;  // very verbose
    pPars->fNotVerbose   =    0;  // skip line-by-line print-out
    pPars->iFrame        =    0;  // explored up to this frame
    pPars->nFailOuts     =    0;  // the number of failed outputs
    pPars->nDropOuts     =    0;  // the number of dropped outputs
    pPars->pFuncOnFrameDone = pAbc->pFuncOnFrameDone; // frame done callback

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PCFATgevwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nProcs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nProcs < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimit < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesMax < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesAdd < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'g':
            pPars->fUseGlucose ^= 1;
            break;
        case 'e':
            pPars->fUseEliminate ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmcs(): There is no AIG.\n" );
        return 0;
    }
    if ( pPars->nProcs > 4 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmcs(): Currently this command can run at most 4 concurrent solvers.\n" );
        return 0;
    }
    pAbc->Status  = pPars->fUseGlucose ? Bmcg_ManPerform(pAbc->pGia, pPars) : Bmcs_ManPerform(pAbc->pGia, pPars);
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &bmcs [-PCFAT num] [-gevwh]\n" );
    Abc_Print( -2, "\t         performs bounded model checking\n" );
    Abc_Print( -2, "\t-P num : the number of parallel solvers [default = %d]\n",              pPars->nProcs );
    Abc_Print( -2, "\t-C num : the SAT solver conflict limit [default = %d]\n",               pPars->nConfLimit );
    Abc_Print( -2, "\t-F num : the maximum number of timeframes [default = %d]\n",            pPars->nFramesMax );
    Abc_Print( -2, "\t-A num : the number of additional frames to unroll [default = %d]\n",   pPars->nFramesAdd );
    Abc_Print( -2, "\t-T num : approximate timeout in seconds [default = %d]\n",              pPars->nTimeOut );
    Abc_Print( -2, "\t-g     : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n", pPars->fUseGlucose?  "Glucose" : "Satoko" );
    Abc_Print( -2, "\t-e     : toggle using variable eliminatation [default = %s]\n",         pPars->fUseEliminate?"yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",         pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing information about unfolding [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}